

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Gia_ObjComputeEdgeDelay
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              int fUseTwo)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint *puVar19;
  int iVar20;
  
  if ((iObj < 0) || (vEdge1->nSize <= iObj)) goto LAB_006b7b66;
  piVar15 = vEdge1->pArray;
  piVar15[(uint)iObj] = 0;
  if (vEdge2->nSize <= iObj) goto LAB_006b7b66;
  piVar4 = vEdge2->pArray;
  piVar4[(uint)iObj] = 0;
  pVVar5 = p->vMapping;
  if (pVVar5 == (Vec_Int_t *)0x0) {
LAB_006b77de:
    if (p->vMapping2->nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar5 = p->vMapping2->pArray;
    uVar2 = pVVar5[(uint)iObj].nSize;
    if ((ulong)uVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x163,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (4 < (int)uVar2) {
      __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x14d,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if ((int)uVar2 < 1) {
LAB_006b78b3:
      uVar13 = 0xffffffff;
      iVar10 = 0;
      iVar9 = 0;
      iVar20 = 0;
      uVar16 = 0xffffffff;
    }
    else {
      uVar14 = 0;
      uVar17 = (ulong)(uint)pVVar5[(uint)iObj].nSize;
      if (pVVar5[(uint)iObj].nSize < 1) {
        uVar17 = uVar14;
      }
      uVar16 = 0xffffffff;
      uVar13 = 0xffffffff;
      iVar20 = 0;
      iVar11 = 0;
      iVar7 = 0;
      do {
        if (uVar17 == uVar14) goto LAB_006b7b47;
        uVar3 = pVVar5[(uint)iObj].pArray[uVar14];
        if (((long)(int)uVar3 < 0) || (vDelay->nSize <= (int)uVar3)) goto LAB_006b7b47;
        iVar9 = vDelay->pArray[(int)uVar3] + 10;
        if (iVar11 < iVar9) {
          iVar20 = 1;
          iVar10 = iVar9;
          uVar13 = uVar3;
          iVar9 = iVar11;
        }
        else {
          iVar10 = iVar11;
          if (iVar11 == iVar9) {
            iVar20 = iVar20 + 1;
            iVar9 = iVar7;
            uVar16 = uVar3;
            if (fUseTwo == 0) {
              iVar9 = iVar11;
            }
          }
          else if (iVar9 < iVar7) {
            iVar9 = iVar7;
          }
        }
        uVar14 = uVar14 + 1;
        iVar11 = iVar10;
        iVar7 = iVar9;
      } while (uVar2 != uVar14);
    }
  }
  else {
    if (pVVar5->nSize <= iObj) goto LAB_006b7b47;
    piVar6 = pVVar5->pArray;
    uVar2 = piVar6[(uint)iObj];
    uVar17 = (ulong)uVar2;
    if (uVar17 == 0) goto LAB_006b77de;
    if (((int)uVar2 < 0) || (pVVar5->nSize <= (int)uVar2)) goto LAB_006b7b47;
    iVar11 = piVar6[uVar17];
    if (4 < (long)iVar11) {
      __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x135,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (iVar11 < 1) goto LAB_006b78b3;
    lVar18 = 0;
    uVar16 = 0xffffffff;
    uVar13 = 0xffffffff;
    iVar20 = 0;
    iVar7 = 0;
    iVar12 = 0;
    do {
      uVar2 = piVar6[uVar17 + lVar18 + 1];
      if (((long)(int)uVar2 < 0) || (vDelay->nSize <= (int)uVar2)) goto LAB_006b7b47;
      iVar9 = vDelay->pArray[(int)uVar2] + 10;
      if (iVar7 < iVar9) {
        iVar20 = 1;
        iVar10 = iVar9;
        iVar9 = iVar7;
        uVar13 = uVar2;
      }
      else {
        iVar10 = iVar7;
        if (iVar7 == iVar9) {
          iVar20 = iVar20 + 1;
          iVar9 = iVar12;
          uVar16 = uVar2;
          if (fUseTwo == 0) {
            iVar9 = iVar7;
          }
        }
        else if (iVar9 < iVar12) {
          iVar9 = iVar12;
        }
      }
      lVar18 = lVar18 + 1;
      iVar7 = iVar10;
      iVar12 = iVar9;
    } while (iVar11 != lVar18);
  }
  if (iVar20 < 1) {
    __assert_fail("nCountMax > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                  ,0x164,
                  "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (10 < iVar10) {
    puVar19 = (uint *)(piVar15 + (uint)iObj);
    puVar1 = (uint *)(piVar4 + (uint)iObj);
    if (iVar20 == 1) {
      if ((((int)uVar13 < 0) || (vEdge1->nSize <= (int)uVar13)) || (vEdge2->nSize <= (int)uVar13))
      goto LAB_006b7b47;
      if (0 < piVar15[uVar13] && 0 < piVar4[uVar13]) goto LAB_006b78d6;
      if ((piVar15[uVar13] == 0) || (piVar15 = piVar4, piVar4[uVar13] == 0)) {
        piVar15[uVar13] = iObj;
      }
      if (vEdge1->nSize <= iObj) goto LAB_006b7b47;
      if (*puVar19 != 0) {
        if (vEdge2->nSize <= iObj) goto LAB_006b7b47;
        puVar19 = puVar1;
        if (*puVar1 != 0) goto LAB_006b7b35;
      }
      *puVar19 = uVar13;
LAB_006b7b35:
      if (vDelay->nSize <= iObj) goto LAB_006b7b66;
      iVar11 = iVar10 + -8;
      if (iVar10 + -8 < iVar9) {
        iVar11 = iVar9;
      }
      goto LAB_006b78df;
    }
    if (iVar20 == 2 && fUseTwo != 0) {
      if (((((int)uVar13 < 0) || (vEdge1->nSize <= (int)uVar13)) || (vEdge2->nSize <= (int)uVar13))
         || ((((int)uVar16 < 0 || (vEdge1->nSize <= (int)uVar16)) || (vEdge2->nSize <= (int)uVar16))
            )) goto LAB_006b7b47;
      if ((piVar15[uVar13] < 1 || piVar4[uVar13] < 1) && (piVar15[uVar16] < 1 || piVar4[uVar16] < 1)
         ) {
        piVar6 = piVar15;
        if ((piVar15[uVar13] == 0) || (piVar6 = piVar4, piVar4[uVar13] == 0)) {
          piVar6[uVar13] = iObj;
        }
        if (vEdge1->nSize <= (int)uVar16) goto LAB_006b7b47;
        piVar15 = piVar15 + uVar16;
        if (*piVar15 == 0) {
LAB_006b7af4:
          *piVar15 = iObj;
        }
        else {
          if (vEdge2->nSize <= (int)uVar16) goto LAB_006b7b47;
          piVar15 = piVar4 + uVar16;
          if (*piVar15 == 0) goto LAB_006b7af4;
        }
        if (vEdge1->nSize <= iObj) goto LAB_006b7b47;
        puVar8 = puVar19;
        if (*puVar19 == 0) {
LAB_006b7b15:
          *puVar8 = uVar13;
        }
        else {
          if (vEdge2->nSize <= iObj) goto LAB_006b7b47;
          puVar8 = puVar1;
          if (*puVar1 == 0) goto LAB_006b7b15;
        }
        if (vEdge1->nSize <= iObj) {
LAB_006b7b47:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*puVar19 != 0) {
          if (vEdge2->nSize <= iObj) goto LAB_006b7b47;
          puVar19 = puVar1;
          if (*puVar1 != 0) goto LAB_006b7b35;
        }
        *puVar19 = uVar16;
        goto LAB_006b7b35;
      }
    }
  }
LAB_006b78d6:
  iVar11 = iVar10;
  if (vDelay->nSize <= iObj) {
LAB_006b7b66:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_006b78df:
  vDelay->pArray[(uint)iObj] = iVar11;
  return iVar11;
}

Assistant:

int Gia_ObjComputeEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, int fUseTwo )
{
    int i, iFan, Delay, Status1, Status2;
    int DelayMax = 0, DelayMax2 = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else assert( 0 );
    assert( nCountMax > 0 );
    if ( DelayMax <= 10 )
    {} // skip first level
    else if ( nCountMax == 1 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    else if ( fUseTwo && nCountMax == 2 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    return DelayMax;
}